

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdoc.c
# Opt level: O1

void prvTidyCleanGoogleDocument(TidyDocImpl *doc)

{
  TidyTagId TVar1;
  Node *pNVar2;
  Node *pNVar3;
  Bool BVar4;
  Stack *stack;
  AttVal *pAVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node **ppNVar8;
  
  stack = prvTidynewStack(doc,0x10);
  pNVar6 = (doc->root).content;
  if (pNVar6 != (Node *)0x0) {
    do {
      pNVar7 = pNVar6->next;
      BVar4 = prvTidynodeIsElement(pNVar6);
      if (BVar4 == no) goto LAB_00135b97;
      if ((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TidyTag_STYLE)) {
        prvTidyDiscardElement(doc,pNVar6);
      }
      if (pNVar6->tag == (Dict *)0x0) {
LAB_00135ae6:
        if (pNVar6->attributes != (AttVal *)0x0) {
          prvTidyDropAttrByName(doc,pNVar6,"class");
        }
        prvTidypush(stack,pNVar7);
        pNVar6 = pNVar6->content;
      }
      else {
        TVar1 = pNVar6->tag->id;
        if (TVar1 == TidyTag_A) {
          if (pNVar6->content != (Node *)0x0) goto LAB_00135ae6;
          pAVar5 = prvTidyGetAttrByName(pNVar6,"name");
          if (pAVar5 == (AttVal *)0x0) {
            pAVar5 = prvTidyGetAttrByName(pNVar6,anon_var_dwarf_1aa34 + 0x2b);
          }
          if (pAVar5 != (AttVal *)0x0) {
            prvTidyRepairAttrValue(doc,pNVar6->parent,anon_var_dwarf_1aa34 + 0x2b,pAVar5->value);
          }
LAB_00135b56:
          prvTidyDiscardElement(doc,pNVar6);
        }
        else {
          if (TVar1 != TidyTag_SPAN) {
            if ((TVar1 == TidyTag_P) && (pNVar6->content == (Node *)0x0)) goto LAB_00135b56;
            goto LAB_00135ae6;
          }
          pNVar7 = pNVar6->content;
          if (pNVar7 == (Node *)0x0) {
            pNVar7 = prvTidyDiscardElement(doc,pNVar6);
          }
          else {
            pNVar2 = pNVar6->parent;
            pNVar3 = pNVar6->last;
            pNVar3->next = pNVar6->next;
            ppNVar8 = &pNVar6->next->prev;
            if (pNVar6->next == (Node *)0x0) {
              ppNVar8 = &pNVar2->last;
            }
            *ppNVar8 = pNVar3;
            if (pNVar6->prev == (Node *)0x0) {
              ppNVar8 = &pNVar2->content;
            }
            else {
              pNVar7->prev = pNVar6->prev;
              ppNVar8 = &pNVar6->prev->next;
            }
            *ppNVar8 = pNVar7;
            pNVar7 = pNVar6->content;
            for (pNVar3 = pNVar7; pNVar3 != (Node *)0x0; pNVar3 = pNVar3->next) {
              pNVar3->parent = pNVar2;
            }
            pNVar6->next = (Node *)0x0;
            pNVar6->content = (Node *)0x0;
            prvTidyFreeNode(doc,pNVar6);
          }
        }
LAB_00135b97:
        pNVar6 = pNVar7;
        if (pNVar7 == (Node *)0x0) {
          pNVar6 = prvTidypop(stack);
        }
      }
    } while (pNVar6 != (Node *)0x0);
    prvTidyfreeStack(stack);
  }
  pNVar6 = prvTidyFindHEAD(doc);
  if (pNVar6 == (Node *)0x0) {
    return;
  }
  pNVar7 = prvTidyInferredTag(doc,TidyTag_META);
  prvTidyAddAttribute(doc,pNVar7,"http-equiv","Content-Type");
  prvTidyAddAttribute(doc,pNVar7,"content","text/html; charset=UTF-8");
  prvTidyInsertNodeAtStart(pNVar6,pNVar7);
  return;
}

Assistant:

void TY_(CleanGoogleDocument)( TidyDocImpl* doc )
{
    /* placeholder.  CleanTree()/CleanNode() will not
    ** zap root element 
    */
    CleanNode( doc, &doc->root );
    SetUTF8( doc );
}